

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

void __thiscall
toml::basic_value<toml::type_config>::throw_bad_cast
          (basic_value<toml::type_config> *this,string *funcname,value_t ty)

{
  type_error *this_00;
  error_info *err;
  string local_110;
  error_info local_f0;
  source_location local_98;
  
  this_00 = (type_error *)__cxa_allocate_exception(0xa0);
  toml::detail::make_type_error<toml::type_config>(&local_f0,this,funcname,ty);
  format_error_abi_cxx11_(&local_110,(toml *)&local_f0,err);
  source_location::source_location(&local_98,&this->region_);
  type_error::type_error(this_00,&local_110,&local_98);
  __cxa_throw(this_00,&type_error::typeinfo,type_error::~type_error);
}

Assistant:

[[noreturn]]
    void throw_bad_cast(const std::string& funcname, const value_t ty) const
    {
        throw type_error(format_error(detail::make_type_error(*this, funcname, ty)),
                         this->location());
    }